

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O2

int color_char_to_attr(char c)

{
  int iVar1;
  long lVar2;
  color_type *pcVar3;
  
  if (c < '\0') {
    iVar1 = (int)c;
  }
  else {
    if ((c & 0x5fU) == 0) {
      return 0;
    }
    pcVar3 = color_table;
    iVar1 = 1;
    for (lVar2 = 0; lVar2 != 0x1e; lVar2 = lVar2 + 1) {
      if (pcVar3->index_char == c) {
        return (int)lVar2;
      }
      pcVar3 = pcVar3 + 1;
    }
  }
  return iVar1;
}

Assistant:

int color_char_to_attr(char c)
{
	int a;

	/* Is negative -- spit it right back out */
	if (c < 0) return (c);

	/* Is a space or '\0' -- return black */
	if (c == '\0' || c == ' ') return (COLOUR_DARK);

	/* Search the color table */
	for (a = 0; a < BASIC_COLORS; a++)
	{
		/* Look for the index */
		if (color_table[a].index_char == c) break;
	}

	/* If we don't find the color, we assume white */
	if (a == BASIC_COLORS) return (COLOUR_WHITE);

	/* Return the color */
	return (a);
}